

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O1

void __thiscall
asl::Array<asl::Map<asl::String,_asl::String>::KeyVal>::free
          (Array<asl::Map<asl::String,_asl::String>::KeyVal> *this,void *__ptr)

{
  KeyVal *pKVar1;
  long lVar2;
  long lVar3;
  
  pKVar1 = this->_a;
  lVar2 = (long)*(int *)&pKVar1[-1].value.field_2;
  if (lVar2 != 0) {
    lVar3 = 0;
    do {
      if (*(int *)((long)&(pKVar1->value)._size + lVar3) != 0) {
        ::free(*(void **)((long)&(pKVar1->value).field_2 + lVar3));
      }
      if (*(int *)((long)&(pKVar1->key)._size + lVar3) != 0) {
        ::free(*(void **)((long)&(pKVar1->key).field_2 + lVar3));
      }
      lVar3 = lVar3 + 0x30;
    } while (lVar2 * 0x30 != lVar3);
  }
  ::free(&this->_a[-1].value.field_2);
  this->_a = (KeyVal *)0x0;
  return;
}

Assistant:

void Array<T>::free()
{
	asl_destroy(_a, d().n);
	ASL_RC_FREE();
	::free( (char*)_a - sizeof(Data) );
	_a=0;
}